

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void Assimp::IFC::ConvertVector(IfcVector3 *out,IfcVector *in)

{
  IfcDirection *in_00;
  
  in_00 = STEP::Lazy::operator_cast_to_IfcDirection_
                    ((Lazy *)&(in->super_IfcGeometricRepresentationItem).field_0x30);
  ConvertDirection(out,in_00);
  aiVector3t<double>::operator*=(out,in->Magnitude);
  return;
}

Assistant:

void ConvertVector(IfcVector3& out, const Schema_2x3::IfcVector& in)
{
    ConvertDirection(out,in.Orientation);
    out *= in.Magnitude;
}